

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Display.cpp
# Opt level: O0

XIM sf::priv::OpenXIM(void)

{
  long lVar1;
  undefined8 uVar2;
  string prevXLoc;
  string prevLoc;
  char *p;
  Lock lock;
  XIM p_Var3;
  Mutex *in_stack_ffffffffffffff48;
  Lock *in_stack_ffffffffffffff50;
  char *pcVar4;
  char *local_98;
  char *local_78;
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  char *local_10;
  
  Lock::Lock(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  if ((anonymous_namespace)::referenceCountXIM == 0) {
    local_10 = setlocale(6,(char *)0x0);
    local_78 = local_10;
    if (local_10 == (char *)0x0) {
      local_78 = "";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,local_78,&local_31);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
    local_10 = (char *)XSetLocaleModifiers(0);
    local_98 = local_10;
    if (local_10 == (char *)0x0) {
      local_98 = "";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,local_98,&local_69);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    pcVar4 = "";
    setlocale(6,"");
    XSetLocaleModifiers(pcVar4);
    (anonymous_namespace)::sharedXIM = (XIM)XOpenIM((anonymous_namespace)::sharedDisplay,0,0);
    lVar1 = std::__cxx11::string::length();
    if (lVar1 != 0) {
      pcVar4 = (char *)std::__cxx11::string::c_str();
      setlocale(6,pcVar4);
    }
    lVar1 = std::__cxx11::string::length();
    if (lVar1 != 0) {
      uVar2 = std::__cxx11::string::c_str();
      XSetLocaleModifiers(uVar2);
    }
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string(local_30);
  }
  (anonymous_namespace)::referenceCountXIM = (anonymous_namespace)::referenceCountXIM + 1;
  p_Var3 = (anonymous_namespace)::sharedXIM;
  Lock::~Lock((Lock *)(anonymous_namespace)::sharedXIM);
  return p_Var3;
}

Assistant:

XIM OpenXIM()
{
    Lock lock(mutex);

    assert(sharedDisplay != NULL);

    if (referenceCountXIM == 0)
    {
        // Create a new XIM instance

        // We need the default (environment) locale and X locale for opening
        // the IM and properly receiving text
        // First save the previous ones (this might be able to be written more elegantly?)
        const char* p;
        std::string prevLoc((p = setlocale(LC_ALL, NULL)) ? p : "");
        std::string prevXLoc((p = XSetLocaleModifiers(NULL)) ? p : "");

        // Set the locales from environment
        setlocale(LC_ALL, "");
        XSetLocaleModifiers("");

        // Create the input context
        sharedXIM = XOpenIM(sharedDisplay, NULL, NULL, NULL);

        // Restore the previous locale
        if (prevLoc.length() != 0)
            setlocale(LC_ALL, prevLoc.c_str());

        if (prevXLoc.length() != 0)
            XSetLocaleModifiers(prevXLoc.c_str());
    }

    referenceCountXIM++;

    return sharedXIM;
}